

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pcache1ResizeHash(PCache1 *p)

{
  PgHdr1 *pPVar1;
  int iVar2;
  PgHdr1 **ppPVar3;
  uint uVar4;
  PgHdr1 *pPStack_30;
  uint h;
  PgHdr1 *pNext;
  PgHdr1 *pPage;
  uint i;
  uint nNew;
  PgHdr1 **apNew;
  PCache1 *p_local;
  
  pPage._4_4_ = p->nHash << 1;
  if (pPage._4_4_ < 0x100) {
    pPage._4_4_ = 0x100;
  }
  sqlite3_mutex_leave(p->pGroup->mutex);
  if (p->nHash != 0) {
    sqlite3BeginBenignMalloc();
  }
  ppPVar3 = (PgHdr1 **)sqlite3MallocZero(pPage._4_4_ << 3);
  if (p->nHash != 0) {
    sqlite3EndBenignMalloc();
  }
  sqlite3_mutex_enter(p->pGroup->mutex);
  if (ppPVar3 != (PgHdr1 **)0x0) {
    for (pPage._0_4_ = 0; (uint)pPage < p->nHash; pPage._0_4_ = (uint)pPage + 1) {
      pPStack_30 = p->apHash[(uint)pPage];
      while (pPStack_30 != (PgHdr1 *)0x0) {
        uVar4 = pPStack_30->iKey % pPage._4_4_;
        pPVar1 = pPStack_30->pNext;
        pPStack_30->pNext = ppPVar3[uVar4];
        ppPVar3[uVar4] = pPStack_30;
        pPStack_30 = pPVar1;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = ppPVar3;
    p->nHash = pPage._4_4_;
  }
  iVar2 = 7;
  if (p->apHash != (PgHdr1 **)0x0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int pcache1ResizeHash(PCache1 *p){
  PgHdr1 **apNew;
  unsigned int nNew;
  unsigned int i;

  assert( sqlite3_mutex_held(p->pGroup->mutex) );

  nNew = p->nHash*2;
  if( nNew<256 ){
    nNew = 256;
  }

  pcache1LeaveMutex(p->pGroup);
  if( p->nHash ){ sqlite3BeginBenignMalloc(); }
  apNew = (PgHdr1 **)sqlite3MallocZero(sizeof(PgHdr1 *)*nNew);
  if( p->nHash ){ sqlite3EndBenignMalloc(); }
  pcache1EnterMutex(p->pGroup);
  if( apNew ){
    for(i=0; i<p->nHash; i++){
      PgHdr1 *pPage;
      PgHdr1 *pNext = p->apHash[i];
      while( (pPage = pNext)!=0 ){
        unsigned int h = pPage->iKey % nNew;
        pNext = pPage->pNext;
        pPage->pNext = apNew[h];
        apNew[h] = pPage;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = apNew;
    p->nHash = nNew;
  }

  return (p->apHash ? SQLITE_OK : SQLITE_NOMEM);
}